

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

InternalParseResult * __thiscall
Catch::clara::detail::ParserBase::parse(ParserBase *this,Args *args)

{
  Args *in_RSI;
  InternalParseResult *in_RDI;
  InternalParseResult *pIVar1;
  TokenStream *in_stack_ffffffffffffff90;
  undefined1 local_60 [40];
  string local_38 [56];
  
  pIVar1 = in_RDI;
  Args::exeName_abi_cxx11_((Args *)in_RDI);
  TokenStream::TokenStream(in_stack_ffffffffffffff90,in_RSI);
  (**(code **)(*(long *)&in_RSI->m_exeName + 0x18))(pIVar1,in_RSI,local_38,local_60);
  TokenStream::~TokenStream((TokenStream *)0x165b47);
  ::std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

auto parse( Args const &args ) const -> InternalParseResult {
            return parse( args.exeName(), TokenStream( args ) );
        }